

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

void sdf_shape_done(SDF_Shape **shape)

{
  SDF_Shape *pSVar1;
  FT_Memory memory;
  SDF_Contour_ *pSVar2;
  SDF_Contour *in_RAX;
  SDF_Contour *temp;
  SDF_Contour *local_28;
  
  if (shape != (SDF_Shape **)0x0) {
    pSVar1 = *shape;
    if ((pSVar1 != (SDF_Shape *)0x0) && (memory = pSVar1->memory, memory != (FT_Memory)0x0)) {
      pSVar2 = pSVar1->contours;
      while (local_28 = pSVar2, local_28 != (SDF_Contour *)0x0) {
        pSVar2 = local_28->next;
        sdf_contour_done(memory,&local_28);
        in_RAX = local_28;
      }
      local_28 = in_RAX;
      ft_mem_free(memory,*shape);
      *shape = (SDF_Shape *)0x0;
    }
  }
  return;
}

Assistant:

static void
  sdf_shape_done( SDF_Shape**  shape )
  {
    FT_Memory     memory;
    SDF_Contour*  contours;
    SDF_Contour*  temp;


    if ( !shape || !*shape )
      return;

    memory   = (*shape)->memory;
    contours = (*shape)->contours;

    if ( !memory )
      return;

    /* release all contours */
    while ( contours )
    {
      temp     = contours;
      contours = contours->next;

      sdf_contour_done( memory, &temp );
    }

    /* release the allocated shape struct  */
    FT_FREE( *shape );
  }